

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayerSupportVectorMachine.cpp
# Opt level: O0

bool __thiscall tfs::DnnLayerSupportVectorMachine::runForward(DnnLayerSupportVectorMachine *this)

{
  bool bVar1;
  EVP_PKEY_CTX *src;
  Matrix *in_RDI;
  Matrix *matrix;
  
  matrix = in_RDI;
  bVar1 = matrixBad(in_RDI);
  if ((!bVar1) && (bVar1 = matrixBad(matrix), !bVar1)) {
    TMatrix<double>::copy((TMatrix<double> *)in_RDI->m_data,(EVP_PKEY_CTX *)in_RDI->m_c,src);
    return true;
  }
  bVar1 = report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerSupportVectorMachine.cpp"
                         ,"runForward",0x1c,"Not configured");
  return bVar1;
}

Assistant:

bool
    DnnLayerSupportVectorMachine::runForward(  void ) {
        // -----------------------------------------------------------------------------------
        // virtual: Forward propagate, used with forward()
        // -----------------------------------------------------------------------------------
        if( matrixBad( m_in_a ) || matrixBad( m_out_a )) {
            return log_error( "Not configured" );
        }
        m_out_a->copy( *m_in_a );   // Simple identity
        return true;
    }